

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioaWriteAig.c
# Opt level: O3

void Ioa_WriteAigerBufferTest(Aig_Man_t *pMan,char *pFileName,int fWriteSymbols,int fCompact)

{
  undefined8 in_RAX;
  FILE *__s;
  char *pcVar1;
  int nSize;
  int local_24;
  
  local_24 = (int)((ulong)in_RAX >> 0x20);
  if (pMan->nObjs[3] == 0) {
    puts("AIG cannot be written because it has no POs.");
    return;
  }
  __s = fopen(pFileName,"wb");
  if (__s != (FILE *)0x0) {
    pcVar1 = Ioa_WriteAigerIntoMemory(pMan,&local_24);
    fwrite(pcVar1,1,(long)local_24,__s);
    if (pcVar1 != (char *)0x0) {
      free(pcVar1);
    }
    pcVar1 = Ioa_TimeStamp();
    fprintf(__s,"\nThis file was produced by the IOA package in ABC on %s\n",pcVar1);
    fprintf(__s,"For information about AIGER format, refer to %s\n","http://fmv.jku.at/aiger");
    fclose(__s);
    return;
  }
  fprintf(_stdout,"Ioa_WriteAiger(): Cannot open the output file \"%s\".\n",pFileName);
  return;
}

Assistant:

void Ioa_WriteAigerBufferTest( Aig_Man_t * pMan, char * pFileName, int fWriteSymbols, int fCompact )
{
    FILE * pFile;
    char * pBuffer;
    int nSize;
    if ( Aig_ManCoNum(pMan) == 0 )
    {
        printf( "AIG cannot be written because it has no POs.\n" );
        return;
    }
    // start the output stream
    pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Ioa_WriteAiger(): Cannot open the output file \"%s\".\n", pFileName );
        return;
    }
    // write the buffer
    pBuffer = Ioa_WriteAigerIntoMemory( pMan, &nSize );
    fwrite( pBuffer, 1, nSize, pFile );
    ABC_FREE( pBuffer );
    // write the comment
//    fprintf( pFile, "c" );
//    if ( pMan->pName )
//        fprintf( pFile, "n%s%c", pMan->pName, '\0' );
    fprintf( pFile, "\nThis file was produced by the IOA package in ABC on %s\n", Ioa_TimeStamp() );
    fprintf( pFile, "For information about AIGER format, refer to %s\n", "http://fmv.jku.at/aiger" );
	fclose( pFile );
}